

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

void __thiscall
ON_ModelComponent::SetHiddenModelComponentState(ON_ModelComponent *this,bool bHiddenState)

{
  bool bVar1;
  ON_ComponentStatus component_status;
  ON_ComponentStatus local_1a;
  
  local_1a = this->m_component_status;
  bVar1 = ON_ComponentStatus::IsHidden(&local_1a);
  if (bVar1 != bHiddenState) {
    ON_ComponentStatus::SetHiddenState(&local_1a,bHiddenState);
    bVar1 = SetModelComponentStatus(this,local_1a);
    if (!bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x97f,"","cannot change component hidden state.");
    }
  }
  return;
}

Assistant:

void ON_ModelComponent::SetHiddenModelComponentState(
  bool bHiddenState
  )
{
  ON_ComponentStatus component_status = ModelComponentStatus();
  if (bHiddenState != component_status.IsHidden())
  {
    component_status.SetHiddenState(bHiddenState);
    if (false == SetModelComponentStatus(component_status))
    {
      ON_ERROR("cannot change component hidden state.");
    }
  }
}